

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O1

Symbol * slang::ast::anon_unknown_39::unwrapTypeParam(Scope *scope,Symbol *symbol)

{
  if (symbol->kind == TypeParameter) {
    Compilation::noteReference(scope->compilation,symbol,false);
    symbol = &DeclaredType::getType((DeclaredType *)&symbol[1].location)->super_Symbol;
    if (((Type *)symbol)->canonical == (Type *)0x0) {
      Type::resolveCanonical((Type *)symbol);
    }
    if ((((Type *)symbol)->canonical->super_Symbol).kind == ErrorType) {
      symbol = (Symbol *)0x0;
    }
  }
  return &((Type *)symbol)->super_Symbol;
}

Assistant:

const Symbol* unwrapTypeParam(const Scope& scope, const Symbol* symbol) {
    if (symbol->kind == SymbolKind::TypeParameter) {
        scope.getCompilation().noteReference(*symbol);

        auto result = &symbol->as<TypeParameterSymbol>().targetType.getType();
        if (result->isError())
            return nullptr;

        return result;
    }
    return symbol;
}